

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

bool __thiscall CMU462::DynamicScene::Scene::addObject(Scene *this,SceneObject *o)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  SceneObject *local_10;
  
  p_Var2 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(SceneObject **)(p_Var2 + 1) >= o) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(SceneObject **)(p_Var2 + 1) < o];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(SceneObject **)(p_Var3 + 1) <= o)) {
      return false;
    }
  }
  o->scene = this;
  local_10 = o;
  (**o->_vptr_SceneObject)(o,this->defaultStyle,this->hoveredStyle,this->selectedStyle);
  std::
  _Rb_tree<CMU462::DynamicScene::SceneObject*,CMU462::DynamicScene::SceneObject*,std::_Identity<CMU462::DynamicScene::SceneObject*>,std::less<CMU462::DynamicScene::SceneObject*>,std::allocator<CMU462::DynamicScene::SceneObject*>>
  ::_M_insert_unique<CMU462::DynamicScene::SceneObject*const&>
            ((_Rb_tree<CMU462::DynamicScene::SceneObject*,CMU462::DynamicScene::SceneObject*,std::_Identity<CMU462::DynamicScene::SceneObject*>,std::less<CMU462::DynamicScene::SceneObject*>,std::allocator<CMU462::DynamicScene::SceneObject*>>
              *)&this->objects,&local_10);
  return true;
}

Assistant:

bool Scene::addObject( SceneObject* o )
{
   auto i = objects.find( o );
   if( i != objects.end() )
   {
      return false;
   }

   o->scene = this;
   o->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
   objects.insert( o );
   return true;
}